

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O3

void interrupt(char *data,void *args)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  uint *puVar7;
  
  lVar5 = mraa_iio_get_channels(args);
  iVar3 = mraa_iio_get_channel_count(args);
  if (0 < iVar3) {
    puVar7 = (uint *)(lVar5 + 0x34);
    lVar5 = 0;
    do {
      if (puVar7[-0xc] != 0) {
        fprintf(_stdout,"channel %d - bytes %d\n",(ulong)puVar7[-0xd],(ulong)puVar7[-2]);
        if (puVar7[-2] == 2) {
          uVar1 = *(ushort *)(data + *puVar7);
          uVar2 = uVar1 << 8 | uVar1 >> 8;
          if (puVar7[-9] != 0) {
            uVar2 = uVar1;
          }
          uVar4 = (uint)(uVar2 >> ((byte)puVar7[-1] & 0x1f)) & puVar7[-5];
          if (puVar7[-8] != 0) {
            bVar6 = 0x10 - (char)puVar7[-3];
            uVar4 = (int)(short)(uVar4 << (bVar6 & 0x1f)) >> (bVar6 & 0x1f);
          }
          fprintf(_stdout,"  value = %05f\n",(double)(int)(short)uVar4);
        }
      }
      lVar5 = lVar5 + 1;
      iVar3 = mraa_iio_get_channel_count(args);
      puVar7 = puVar7 + 0xe;
    } while (lVar5 < iVar3);
  }
  return;
}

Assistant:

void
interrupt(char* data, void* args)
{
    mraa_iio_context thisdevice = (mraa_iio_context) args;
    mraa_iio_channel* channels = mraa_iio_get_channels(thisdevice);
    int i = 0;

    for (; i < mraa_iio_get_channel_count(thisdevice); i++) {
        if (channels[i].enabled) {
            fprintf(stdout, "channel %d - bytes %d\n", channels[i].index, channels[i].bytes);
            switch (channels[i].bytes) {
                case 2:
                    printword(*(uint16_t*) (data + channels[i].location), &channels[i]);
            }
        }
    }
}